

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
          (Matcher<fmt::v5::basic_string_view<char>_> *this,basic_string_view<char> value)

{
  MatcherBase<fmt::v5::basic_string_view<char>_> MStack_38;
  char *local_20;
  size_t local_18;
  
  local_18 = value.size_;
  local_20 = value.data_;
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.value_ =
       (MatcherInterface<fmt::v5::basic_string_view<char>_> *)0x0;
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.link_.next_ =
       &(this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.link_;
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001ba818;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<fmt::v5::basic_string_view<char>_> *)&MStack_38,(EqMatcher *)&local_20);
  internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_>::
  operator=(&(this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_,&MStack_38.impl_);
  internal::MatcherBase<fmt::v5::basic_string_view<char>_>::~MatcherBase(&MStack_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }